

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O0

size_t duckdb_zstd::HUF_decompress1X2_usingDTable_internal_bmi2
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable)

{
  uint uVar1;
  DTableDesc DVar2;
  BIT_DStream_t *code;
  uchar *puVar3;
  HUF_DTable *pHVar4;
  size_t sVar5;
  size_t in_RCX;
  void *in_RDX;
  ulong uVar6;
  BIT_DStream_t *in_RSI;
  uchar *in_RDI;
  HUF_DTable *in_R8;
  bool bVar7;
  DTableDesc dtd;
  HUF_DEltX2 *dt;
  void *dtPtr;
  BYTE *oend;
  BYTE *ostart;
  size_t _var_err__;
  BIT_DStream_t bitD;
  BYTE *pStart;
  BIT_DStream_status result;
  U32 nbBytes;
  BIT_DStream_status result_1;
  U32 nbBytes_1;
  BIT_DStream_status result_3;
  U32 nbBytes_3;
  BIT_DStream_status result_2;
  U32 nbBytes_2;
  size_t val_4;
  size_t val_3;
  size_t val_2;
  size_t val_1;
  size_t val;
  size_t val_5;
  size_t val_7;
  size_t val_8;
  size_t val_6;
  size_t val_9;
  size_t val_10;
  size_t val_11;
  void *in_stack_fffffffffffffc08;
  BIT_DStream_t local_398;
  HUF_DTable *local_370;
  BIT_DStream_t *local_358;
  uchar *local_350;
  BIT_DStream_t *local_348;
  uchar *local_340;
  uint local_334;
  HUF_DTable *local_330;
  uchar *local_328;
  BIT_DStream_t *local_320;
  uchar *local_318;
  BIT_DStream_status local_310;
  uint local_30c;
  BIT_DStream_t *local_308;
  BIT_DStream_status local_2fc;
  BIT_DStream_status local_2f8;
  uint local_2f4;
  BIT_DStream_t *local_2f0;
  BIT_DStream_status local_2e4;
  BIT_DStream_status local_2e0;
  uint local_2dc;
  BIT_DStream_t *local_2d8;
  BIT_DStream_status local_2cc;
  BIT_DStream_status local_2c8;
  uint local_2c4;
  BIT_DStream_t *local_2c0;
  BIT_DStream_status local_2b4;
  size_t local_2b0;
  U32 local_2a4;
  HUF_DTable *local_2a0;
  BIT_DStream_t *local_298;
  uchar *local_290;
  size_t local_288;
  U32 local_27c;
  HUF_DTable *local_278;
  BIT_DStream_t *local_270;
  uchar *local_268;
  size_t local_260;
  U32 local_254;
  HUF_DTable *local_250;
  BIT_DStream_t *local_248;
  uchar *local_240;
  size_t local_238;
  U32 local_22c;
  HUF_DTable *local_228;
  BIT_DStream_t *local_220;
  uchar *local_218;
  size_t local_210;
  U32 local_204;
  HUF_DTable *local_200;
  BIT_DStream_t *local_1f8;
  uchar *local_1f0;
  size_t local_1e8;
  U32 local_1dc;
  HUF_DTable *local_1d8;
  BIT_DStream_t *local_1d0;
  uchar *local_1c8;
  size_t local_1c0;
  U32 local_1b4;
  HUF_DTable *local_1b0;
  BIT_DStream_t *local_1a8;
  uchar *local_1a0;
  size_t local_198;
  U32 local_18c;
  HUF_DTable *local_188;
  BIT_DStream_t *local_180;
  uchar *local_178;
  size_t local_170;
  U32 local_164;
  HUF_DTable *local_160;
  BIT_DStream_t *local_158;
  uchar *local_150;
  size_t local_148;
  U32 local_13c;
  HUF_DTable *local_138;
  BIT_DStream_t *local_130;
  uchar *local_128;
  size_t local_120;
  U32 local_114;
  HUF_DTable *local_110;
  BIT_DStream_t *local_108;
  uchar *local_100;
  size_t local_f8;
  U32 local_ec;
  HUF_DTable *local_e8;
  BIT_DStream_t *local_e0;
  uchar *local_d8;
  uint local_cc;
  BIT_DStream_t *local_c8;
  uint local_bc;
  BIT_DStream_t *local_b8;
  uint local_ac;
  BIT_DStream_t *local_a8;
  uint local_9c;
  BIT_DStream_t *local_98;
  uint local_8c;
  BIT_DStream_t *local_88;
  uint local_7c;
  BIT_DStream_t *local_78;
  uint local_6c;
  BIT_DStream_t *local_68;
  uint local_5c;
  BIT_DStream_t *local_58;
  uint local_4c;
  BIT_DStream_t *local_48;
  uint local_3c;
  BIT_DStream_t *local_38;
  uint local_2c;
  BIT_DStream_t *local_28;
  uint local_1c;
  BIT_DStream_t *local_18;
  uint local_c;
  BIT_DStream_t *local_8;
  
  local_370 = in_R8;
  local_358 = in_RSI;
  local_350 = in_RDI;
  code = (BIT_DStream_t *)BIT_initDStream(in_RSI,in_RDX,in_RCX);
  uVar1 = ERR_isError((size_t)code);
  local_348 = code;
  if (uVar1 == 0) {
    puVar3 = ZSTD_maybeNullPtrAdd(local_350,(ptrdiff_t)local_358);
    pHVar4 = local_370 + 1;
    DVar2 = HUF_getDTableDesc(local_370);
    local_318 = local_350;
    local_320 = &local_398;
    local_334 = (uint)DVar2 >> 0x10 & 0xff;
    local_340 = local_350;
    local_330 = pHVar4;
    local_328 = puVar3;
    if ((ulong)((long)puVar3 - (long)local_350) < 8) {
      local_2c0 = local_320;
      if (local_398.bitsConsumed < 0x41) {
        if (local_398.ptr < local_398.limitPtr) {
          if (local_398.ptr == local_398.start) {
            if (local_398.bitsConsumed < 0x40) {
              local_2b4 = BIT_DStream_endOfBuffer;
            }
            else {
              local_2b4 = BIT_DStream_completed;
            }
          }
          else {
            local_2c4 = local_398.bitsConsumed >> 3;
            uVar6 = (ulong)local_2c4;
            if (local_398.ptr + -uVar6 < local_398.start) {
              local_2c4 = (int)local_398.ptr - (int)local_398.start;
            }
            local_2c8 = (BIT_DStream_status)(local_398.ptr + -uVar6 < local_398.start);
            local_398.ptr = local_398.ptr + -(ulong)local_2c4;
            sVar5 = MEM_readLEST(in_stack_fffffffffffffc08);
            local_2c0->bitContainer = sVar5;
            local_2b4 = local_2c8;
          }
        }
        else {
          local_2b4 = BIT_reloadDStream_internal((BIT_DStream_t *)0xa75b29);
        }
      }
      else {
        local_398.ptr = "";
        local_2b4 = BIT_DStream_overflow;
      }
    }
    else if ((local_334 < 0xc) && (uVar1 = MEM_64bits(), uVar1 != 0)) {
      while( true ) {
        local_308 = local_320;
        if (local_320->bitsConsumed < 0x41) {
          if (local_320->ptr < local_320->limitPtr) {
            if (local_320->ptr == local_320->start) {
              if (local_320->bitsConsumed < 0x40) {
                local_2fc = BIT_DStream_endOfBuffer;
              }
              else {
                local_2fc = BIT_DStream_completed;
              }
            }
            else {
              local_30c = local_320->bitsConsumed >> 3;
              bVar7 = local_320->ptr + -(ulong)local_30c < local_320->start;
              if (bVar7) {
                local_30c = (int)local_320->ptr - (int)local_320->start;
              }
              local_310 = (BIT_DStream_status)bVar7;
              local_320->ptr = local_320->ptr + -(ulong)local_30c;
              local_308->bitsConsumed = local_308->bitsConsumed + local_30c * -8;
              sVar5 = MEM_readLEST(in_stack_fffffffffffffc08);
              local_308->bitContainer = sVar5;
              local_2fc = local_310;
            }
          }
          else {
            local_2fc = BIT_reloadDStream_internal((BIT_DStream_t *)0xa74f27);
          }
        }
        else {
          local_320->ptr = "";
          local_2fc = BIT_DStream_overflow;
        }
        if (local_2fc != BIT_DStream_unfinished || local_328 + -9 <= local_318) break;
        local_1f0 = local_318;
        local_1f8 = local_320;
        local_200 = local_330;
        local_204 = local_334;
        local_210 = BIT_lookBitsFast(local_320,local_334);
        *(short *)local_1f0 = (short)local_200[local_210];
        local_48 = local_1f8;
        local_4c = (uint)*(byte *)((long)local_200 + local_210 * 4 + 2);
        local_1f8->bitsConsumed = local_4c + local_1f8->bitsConsumed;
        local_318 = local_318 + *(byte *)((long)local_200 + local_210 * 4 + 3);
        local_220 = local_320;
        local_228 = local_330;
        local_22c = local_334;
        local_218 = local_318;
        local_238 = BIT_lookBitsFast(local_320,local_334);
        *(short *)local_218 = (short)local_228[local_238];
        local_38 = local_220;
        local_3c = (uint)*(byte *)((long)local_228 + local_238 * 4 + 2);
        local_220->bitsConsumed = local_3c + local_220->bitsConsumed;
        local_318 = local_318 + *(byte *)((long)local_228 + local_238 * 4 + 3);
        local_248 = local_320;
        local_250 = local_330;
        local_254 = local_334;
        local_240 = local_318;
        local_260 = BIT_lookBitsFast(local_320,local_334);
        *(short *)local_240 = (short)local_250[local_260];
        local_28 = local_248;
        local_2c = (uint)*(byte *)((long)local_250 + local_260 * 4 + 2);
        local_248->bitsConsumed = local_2c + local_248->bitsConsumed;
        local_318 = local_318 + *(byte *)((long)local_250 + local_260 * 4 + 3);
        local_270 = local_320;
        local_278 = local_330;
        local_27c = local_334;
        local_268 = local_318;
        local_288 = BIT_lookBitsFast(local_320,local_334);
        *(short *)local_268 = (short)local_278[local_288];
        local_18 = local_270;
        local_1c = (uint)*(byte *)((long)local_278 + local_288 * 4 + 2);
        local_270->bitsConsumed = local_1c + local_270->bitsConsumed;
        local_318 = local_318 + *(byte *)((long)local_278 + local_288 * 4 + 3);
        local_298 = local_320;
        local_2a0 = local_330;
        local_2a4 = local_334;
        local_290 = local_318;
        local_2b0 = BIT_lookBitsFast(local_320,local_334);
        *(short *)local_290 = (short)local_2a0[local_2b0];
        local_8 = local_298;
        local_c = (uint)*(byte *)((long)local_2a0 + local_2b0 * 4 + 2);
        local_298->bitsConsumed = local_c + local_298->bitsConsumed;
        local_318 = local_318 + *(byte *)((long)local_2a0 + local_2b0 * 4 + 3);
      }
    }
    else {
      while( true ) {
        local_2f0 = local_320;
        if (local_320->bitsConsumed < 0x41) {
          if (local_320->ptr < local_320->limitPtr) {
            if (local_320->ptr == local_320->start) {
              if (local_320->bitsConsumed < 0x40) {
                local_2e4 = BIT_DStream_endOfBuffer;
              }
              else {
                local_2e4 = BIT_DStream_completed;
              }
            }
            else {
              local_2f4 = local_320->bitsConsumed >> 3;
              bVar7 = local_320->ptr + -(ulong)local_2f4 < local_320->start;
              if (bVar7) {
                local_2f4 = (int)local_320->ptr - (int)local_320->start;
              }
              local_2f8 = (BIT_DStream_status)bVar7;
              local_320->ptr = local_320->ptr + -(ulong)local_2f4;
              local_2f0->bitsConsumed = local_2f0->bitsConsumed + local_2f4 * -8;
              sVar5 = MEM_readLEST(in_stack_fffffffffffffc08);
              local_2f0->bitContainer = sVar5;
              local_2e4 = local_2f8;
            }
          }
          else {
            local_2e4 = BIT_reloadDStream_internal((BIT_DStream_t *)0xa75586);
          }
        }
        else {
          local_320->ptr = "";
          local_2e4 = BIT_DStream_overflow;
        }
        if (local_2e4 != BIT_DStream_unfinished || local_328 + -7 <= local_318) break;
        uVar1 = MEM_64bits();
        if (uVar1 != 0) {
          local_1c8 = local_318;
          local_1d0 = local_320;
          local_1d8 = local_330;
          local_1dc = local_334;
          local_1e8 = BIT_lookBitsFast(local_320,local_334);
          *(short *)local_1c8 = (short)local_1d8[local_1e8];
          local_58 = local_1d0;
          local_5c = (uint)*(byte *)((long)local_1d8 + local_1e8 * 4 + 2);
          local_1d0->bitsConsumed = local_5c + local_1d0->bitsConsumed;
          local_318 = local_318 + *(byte *)((long)local_1d8 + local_1e8 * 4 + 3);
        }
        MEM_64bits();
        local_150 = local_318;
        local_158 = local_320;
        local_160 = local_330;
        local_164 = local_334;
        local_170 = BIT_lookBitsFast(local_320,local_334);
        *(short *)local_150 = (short)local_160[local_170];
        local_88 = local_158;
        local_8c = (uint)*(byte *)((long)local_160 + local_170 * 4 + 2);
        local_158->bitsConsumed = local_8c + local_158->bitsConsumed;
        local_318 = local_318 + *(byte *)((long)local_160 + local_170 * 4 + 3);
        uVar1 = MEM_64bits();
        if (uVar1 != 0) {
          local_1a0 = local_318;
          local_1a8 = local_320;
          local_1b0 = local_330;
          local_1b4 = local_334;
          local_1c0 = BIT_lookBitsFast(local_320,local_334);
          *(short *)local_1a0 = (short)local_1b0[local_1c0];
          local_68 = local_1a8;
          local_6c = (uint)*(byte *)((long)local_1b0 + local_1c0 * 4 + 2);
          local_1a8->bitsConsumed = local_6c + local_1a8->bitsConsumed;
          local_318 = local_318 + *(byte *)((long)local_1b0 + local_1c0 * 4 + 3);
        }
        local_178 = local_318;
        local_180 = local_320;
        local_188 = local_330;
        local_18c = local_334;
        local_198 = BIT_lookBitsFast(local_320,local_334);
        *(short *)local_178 = (short)local_188[local_198];
        local_78 = local_180;
        local_7c = (uint)*(byte *)((long)local_188 + local_198 * 4 + 2);
        local_180->bitsConsumed = local_7c + local_180->bitsConsumed;
        local_318 = local_318 + *(byte *)((long)local_188 + local_198 * 4 + 3);
      }
    }
    if (1 < (ulong)((long)local_328 - (long)local_318)) {
      while( true ) {
        local_2d8 = local_320;
        if (local_320->bitsConsumed < 0x41) {
          if (local_320->ptr < local_320->limitPtr) {
            if (local_320->ptr == local_320->start) {
              if (local_320->bitsConsumed < 0x40) {
                local_2cc = BIT_DStream_endOfBuffer;
              }
              else {
                local_2cc = BIT_DStream_completed;
              }
            }
            else {
              local_2dc = local_320->bitsConsumed >> 3;
              bVar7 = local_320->ptr + -(ulong)local_2dc < local_320->start;
              if (bVar7) {
                local_2dc = (int)local_320->ptr - (int)local_320->start;
              }
              local_2e0 = (BIT_DStream_status)bVar7;
              local_320->ptr = local_320->ptr + -(ulong)local_2dc;
              local_2d8->bitsConsumed = local_2d8->bitsConsumed + local_2dc * -8;
              sVar5 = MEM_readLEST(in_stack_fffffffffffffc08);
              local_2d8->bitContainer = sVar5;
              local_2cc = local_2e0;
            }
          }
          else {
            local_2cc = BIT_reloadDStream_internal((BIT_DStream_t *)0xa75cec);
          }
        }
        else {
          local_320->ptr = "";
          local_2cc = BIT_DStream_overflow;
        }
        if (local_2cc != BIT_DStream_unfinished || local_328 + -2 < local_318) break;
        local_128 = local_318;
        local_130 = local_320;
        local_138 = local_330;
        local_13c = local_334;
        local_148 = BIT_lookBitsFast(local_320,local_334);
        *(short *)local_128 = (short)local_138[local_148];
        local_98 = local_130;
        local_9c = (uint)*(byte *)((long)local_138 + local_148 * 4 + 2);
        local_130->bitsConsumed = local_9c + local_130->bitsConsumed;
        local_318 = local_318 + *(byte *)((long)local_138 + local_148 * 4 + 3);
      }
      for (; local_318 <= local_328 + -2;
          local_318 = local_318 + *(byte *)((long)local_110 + local_120 * 4 + 3)) {
        local_100 = local_318;
        local_108 = local_320;
        local_110 = local_330;
        local_114 = local_334;
        local_120 = BIT_lookBitsFast(local_320,local_334);
        *(short *)local_100 = (short)local_110[local_120];
        local_a8 = local_108;
        local_ac = (uint)*(byte *)((long)local_110 + local_120 * 4 + 2);
        local_108->bitsConsumed = local_ac + local_108->bitsConsumed;
      }
    }
    if (local_318 < local_328) {
      local_d8 = local_318;
      local_e0 = local_320;
      local_e8 = local_330;
      local_ec = local_334;
      local_f8 = BIT_lookBitsFast(local_320,local_334);
      *local_d8 = (uchar)local_e8[local_f8];
      if (*(char *)((long)local_e8 + local_f8 * 4 + 3) == '\x01') {
        local_c8 = local_e0;
        local_cc = (uint)*(byte *)((long)local_e8 + local_f8 * 4 + 2);
        local_e0->bitsConsumed = local_cc + local_e0->bitsConsumed;
      }
      else if (local_e0->bitsConsumed < 0x40) {
        local_b8 = local_e0;
        local_bc = (uint)*(byte *)((long)local_e8 + local_f8 * 4 + 2);
        local_e0->bitsConsumed = local_bc + local_e0->bitsConsumed;
        if (0x40 < local_e0->bitsConsumed) {
          local_e0->bitsConsumed = 0x40;
        }
      }
      local_318 = local_318 + 1;
    }
    uVar1 = BIT_endOfDStream(&local_398);
    if (uVar1 == 0) {
      local_348 = (BIT_DStream_t *)0xffffffffffffffec;
    }
    else {
      local_348 = local_358;
    }
  }
  return (size_t)local_348;
}

Assistant:

size_t HUF_decompress1X2_DCtx_wksp(HUF_DTable* DCtx, void* dst, size_t dstSize,
                                   const void* cSrc, size_t cSrcSize,
                                   void* workSpace, size_t wkspSize, int flags)
{
    const BYTE* ip = (const BYTE*) cSrc;

    size_t const hSize = HUF_readDTableX2_wksp(DCtx, cSrc, cSrcSize,
                                               workSpace, wkspSize, flags);
    if (HUF_isError(hSize)) return hSize;
    if (hSize >= cSrcSize) return ERROR(srcSize_wrong);
    ip += hSize; cSrcSize -= hSize;

    return HUF_decompress1X2_usingDTable_internal(dst, dstSize, ip, cSrcSize, DCtx, flags);
}